

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
booster::locale::basic_format<wchar_t>::basic_format
          (basic_format<wchar_t> *this,string_type *format_string)

{
  pointer pwVar1;
  long lVar2;
  
  (this->message_).n_ = 0;
  (this->message_).c_id_ = (char_type_conflict *)0x0;
  (this->message_).c_context_ = (char_type_conflict *)0x0;
  (this->message_).c_plural_ = (char_type_conflict *)0x0;
  (this->message_).id_._M_dataplus._M_p = (pointer)&(this->message_).id_.field_2;
  (this->message_).id_._M_string_length = 0;
  (this->message_).id_.field_2._M_local_buf[0] = L'\0';
  (this->message_).context_._M_dataplus._M_p = (pointer)&(this->message_).context_.field_2;
  (this->message_).context_._M_string_length = 0;
  (this->message_).context_.field_2._M_local_buf[0] = L'\0';
  (this->message_).plural_._M_dataplus._M_p = (pointer)&(this->message_).plural_.field_2;
  (this->message_).plural_._M_string_length = 0;
  (this->message_).plural_.field_2._M_local_buf[0] = L'\0';
  (this->format_)._M_dataplus._M_p = (pointer)&(this->format_).field_2;
  pwVar1 = (format_string->_M_dataplus)._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&this->format_,pwVar1,pwVar1 + format_string->_M_string_length);
  this->translate_ = false;
  lVar2 = 0;
  do {
    *(undefined8 *)((long)&this->parameters_[0].pointer_ + lVar2) = 0;
    *(code **)((long)&this->parameters_[0].writer_ + lVar2) =
         details::formattible<wchar_t>::void_write;
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  this->parameters_count_ = 0;
  (this->ext_params_).
  super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ext_params_).
  super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ext_params_).
  super__Vector_base<booster::locale::details::formattible<wchar_t>,_std::allocator<booster::locale::details::formattible<wchar_t>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

basic_format(string_type format_string) : 
                format_(format_string),
                translate_(false),
                parameters_count_(0)
            {
            }